

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_ObjDeriveTfo(Acb_Ntk_t *p,int Pivot,int nTfoLevMax,int nFanMax,Vec_Int_t **pvTfo,
                     Vec_Int_t **pvRoots,int fDelay)

{
  int iVar1;
  Vec_Int_t *vTfo;
  Vec_Int_t *vRoots;
  
  iVar1 = Acb_ObjLabelTfo(p,Pivot,nTfoLevMax,nFanMax,fDelay);
  vTfo = Vec_IntAlloc(10);
  *pvTfo = vTfo;
  vRoots = Vec_IntAlloc(10);
  *pvRoots = vRoots;
  if (iVar1 != 0) {
    return;
  }
  Acb_NtkIncTravId(p);
  Acb_ObjDeriveTfo_rec(p,Pivot,vTfo,vRoots,fDelay);
  iVar1 = Vec_IntEntryLast(vTfo);
  if (iVar1 == Pivot) {
    Vec_IntPop(vTfo);
    iVar1 = Vec_IntEntryLast(vRoots);
    if (iVar1 != Pivot) {
      Vec_IntReverseOrder(vTfo);
      Vec_IntReverseOrder(vRoots);
      return;
    }
    __assert_fail("Vec_IntEntryLast(vRoots) != Pivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x283,
                  "void Acb_ObjDeriveTfo(Acb_Ntk_t *, int, int, int, Vec_Int_t **, Vec_Int_t **, int)"
                 );
  }
  __assert_fail("Vec_IntEntryLast(vTfo) == Pivot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x281,
                "void Acb_ObjDeriveTfo(Acb_Ntk_t *, int, int, int, Vec_Int_t **, Vec_Int_t **, int)"
               );
}

Assistant:

void Acb_ObjDeriveTfo( Acb_Ntk_t * p, int Pivot, int nTfoLevMax, int nFanMax, Vec_Int_t ** pvTfo, Vec_Int_t ** pvRoots, int fDelay )
{
    int Res = Acb_ObjLabelTfo( p, Pivot, nTfoLevMax, nFanMax, fDelay );
    Vec_Int_t * vTfo   = *pvTfo   = Vec_IntAlloc( 10 );
    Vec_Int_t * vRoots = *pvRoots = Vec_IntAlloc( 10 );
    if ( Res ) // none or root
        return;
    Acb_NtkIncTravId( p ); // root (2)   inner (1)  visited (0)
    Acb_ObjDeriveTfo_rec( p, Pivot, vTfo, vRoots, fDelay );
    assert( Vec_IntEntryLast(vTfo) == Pivot );
    Vec_IntPop( vTfo );
    assert( Vec_IntEntryLast(vRoots) != Pivot );
    Vec_IntReverseOrder( vTfo );
    Vec_IntReverseOrder( vRoots );
}